

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::StartTracingResponse::ParseFromArray
          (StartTracingResponse *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  uint8_t cur_byte_1;
  ulong *puVar8;
  uint uVar9;
  uint8_t cur_byte_2;
  ulong *puVar10;
  uint8_t cur_byte_3;
  ulong uVar11;
  uint8_t cur_byte;
  ulong *puVar12;
  Field local_40;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar7 = (ulong *)(size + (long)raw);
  local_40.int_value_ = 0;
LAB_00251137:
  if (puVar7 <= raw) goto switchD_00251186_caseD_3;
  bVar1 = (byte)*raw;
  uVar3 = (ulong)bVar1;
  puVar10 = (ulong *)((long)raw + 1);
  if ((char)bVar1 < '\0') {
    uVar3 = (ulong)(bVar1 & 0x7f);
    lVar5 = 7;
    do {
      if ((puVar7 <= puVar10) || (0x38 < lVar5 - 7U)) goto switchD_00251186_caseD_3;
      uVar11 = *puVar10;
      puVar10 = (ulong *)((long)puVar10 + 1);
      uVar3 = uVar3 | (ulong)((byte)uVar11 & 0x7f) << ((byte)lVar5 & 0x3f);
      lVar5 = lVar5 + 7;
    } while ((char)(byte)uVar11 < '\0');
  }
  uVar9 = (uint)(uVar3 >> 3);
  if ((uVar9 == 0) || (puVar7 <= puVar10)) goto switchD_00251186_caseD_3;
  switch((uint)uVar3 & 7) {
  case 0:
    uVar11 = 0;
    uVar4 = 0;
    while( true ) {
      puVar12 = (ulong *)((long)puVar10 + 1);
      uVar11 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar4 & 0x3f) | uVar11;
      if (-1 < (char)(byte)*puVar10) break;
      if ((puVar7 <= puVar12) || (bVar2 = 0x38 < uVar4, uVar4 = uVar4 + 7, puVar10 = puVar12, bVar2)
         ) goto switchD_00251186_caseD_3;
    }
    uVar4 = uVar11 & 0xffffffff00000000;
LAB_0025125b:
    uVar6 = 0;
LAB_0025125d:
    raw = puVar12;
    if ((uVar9 < 0x10000) && (uVar6 < 0x10000000)) {
      local_40.int_value_ = uVar4 | uVar11 & 0xffffffff;
      uVar3 = uVar6 | (uVar3 >> 3) << 0x20 | (uVar3 & 7) << 0x30;
LAB_002512fc:
LAB_0025130c:
      local_40.size_ = (uint32_t)uVar3;
      local_40.type_ = (uint8_t)(uVar3 >> 0x30);
      local_40.id_ = (uint16_t)(uVar3 >> 0x20);
      if (local_40.id_ == 1) {
        *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
             (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
      }
      else if ((uVar3 & 0xffff00000000) == 0) {
        return puVar7 == puVar12;
      }
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                (&local_40,&this->unknown_fields_);
      puVar10 = puVar12;
LAB_00251346:
      if (puVar7 <= puVar10) goto switchD_00251394_caseD_3;
      bVar1 = (byte)*puVar10;
      uVar3 = (ulong)bVar1;
      puVar8 = (ulong *)((long)puVar10 + 1);
      if ((char)bVar1 < '\0') {
        uVar3 = (ulong)(bVar1 & 0x7f);
        lVar5 = 7;
        do {
          if ((puVar7 <= puVar8) || (0x38 < lVar5 - 7U)) goto switchD_00251394_caseD_3;
          uVar11 = *puVar8;
          puVar8 = (ulong *)((long)puVar8 + 1);
          uVar3 = uVar3 | (ulong)((byte)uVar11 & 0x7f) << ((byte)lVar5 & 0x3f);
          lVar5 = lVar5 + 7;
        } while ((char)(byte)uVar11 < '\0');
      }
      uVar9 = (uint)(uVar3 >> 3);
      if ((uVar9 == 0) || (puVar7 <= puVar8)) goto switchD_00251394_caseD_3;
      switch((uint)uVar3 & 7) {
      case 0:
        uVar11 = 0;
        uVar4 = 0;
        while( true ) {
          puVar12 = (ulong *)((long)puVar8 + 1);
          uVar11 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar4 & 0x3f) | uVar11;
          if (-1 < (char)(byte)*puVar8) break;
          if ((puVar7 <= puVar12) ||
             (bVar2 = 0x38 < uVar4, uVar4 = uVar4 + 7, puVar8 = puVar12, bVar2))
          goto switchD_00251394_caseD_3;
        }
        local_40.int_value_ = uVar11 & 0xffffffff00000000;
LAB_0025146a:
        uVar4 = 0;
LAB_0025146c:
        puVar10 = puVar12;
        if ((0xffff < uVar9) || (0xfffffff < uVar4)) goto LAB_00251346;
        local_40.int_value_ = local_40.int_value_ | uVar11 & 0xffffffff;
        uVar3 = uVar4 | (uVar3 >> 3) << 0x20 | (uVar3 & 7) << 0x30;
        goto LAB_0025130c;
      case 1:
        puVar12 = puVar8 + 1;
        if (puVar12 <= puVar7) {
          uVar11 = *puVar8;
          local_40.int_value_ = uVar11 & 0xffffffff00000000;
          goto LAB_0025146a;
        }
        break;
      case 2:
        puVar8 = (ulong *)((long)puVar8 + 1);
        uVar4 = 0;
        uVar11 = 0;
        puVar12 = puVar8;
        while (uVar4 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar11 & 0x3f) |
                       uVar4, (char)*(byte *)((long)puVar12 + -1) < '\0') {
          if (puVar7 <= puVar12) goto switchD_00251394_caseD_3;
          puVar12 = (ulong *)((long)puVar12 + 1);
          puVar8 = (ulong *)((long)puVar8 + 1);
          bVar2 = 0x38 < uVar11;
          uVar11 = uVar11 + 7;
          if (bVar2) goto switchD_00251394_caseD_3;
        }
        if (uVar4 <= (ulong)((long)puVar7 - (long)puVar8)) {
          local_40.int_value_ = (ulong)puVar8 & 0xffffffff00000000;
          puVar12 = (ulong *)((long)puVar12 + uVar4);
          uVar11 = (ulong)puVar8 & 0xffffffff;
          goto LAB_0025146c;
        }
        break;
      case 5:
        puVar12 = (ulong *)((long)puVar8 + 4);
        if (puVar12 <= puVar7) {
          uVar11 = (ulong)(uint)*puVar8;
          local_40.int_value_ = 0;
          goto LAB_0025146a;
        }
      }
switchD_00251394_caseD_3:
      local_40.int_value_ = 0;
      uVar3 = 0;
      puVar12 = puVar10;
      goto LAB_0025130c;
    }
    goto LAB_00251137;
  case 1:
    puVar12 = puVar10 + 1;
    if (puVar12 <= puVar7) {
      uVar11 = *puVar10;
      uVar4 = uVar11 & 0xffffffff00000000;
      goto LAB_0025125b;
    }
    break;
  case 2:
    puVar10 = (ulong *)((long)puVar10 + 1);
    uVar6 = 0;
    uVar11 = 0;
    puVar12 = puVar10;
    while (uVar6 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar11 & 0x3f) | uVar6,
          (char)*(byte *)((long)puVar12 + -1) < '\0') {
      if (puVar7 <= puVar12) goto switchD_00251186_caseD_3;
      puVar12 = (ulong *)((long)puVar12 + 1);
      puVar10 = (ulong *)((long)puVar10 + 1);
      bVar2 = 0x38 < uVar11;
      uVar11 = uVar11 + 7;
      if (bVar2) goto switchD_00251186_caseD_3;
    }
    if (uVar6 <= (ulong)((long)puVar7 - (long)puVar10)) {
      uVar4 = (ulong)puVar10 & 0xffffffff00000000;
      puVar12 = (ulong *)((long)puVar12 + uVar6);
      uVar11 = (ulong)puVar10 & 0xffffffff;
      goto LAB_0025125d;
    }
    break;
  case 5:
    puVar12 = (ulong *)((long)puVar10 + 4);
    if (puVar12 <= puVar7) {
      uVar11 = (ulong)(uint)*puVar10;
      uVar4 = 0;
      goto LAB_0025125b;
    }
  }
switchD_00251186_caseD_3:
  uVar3 = 0;
  puVar12 = (ulong *)raw;
  goto LAB_002512fc;
}

Assistant:

bool StartTracingResponse::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}